

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceFieldOptions.hpp
# Opt level: O2

void __thiscall OpenMD::ForceFieldOptions::validateOptions(ForceFieldOptions *this)

{
  pointer pcVar1;
  bool bVar2;
  allocator<char> local_8d4;
  allocator<char> local_8d3;
  allocator<char> local_8d2;
  allocator<char> local_8d1;
  EqualIgnoreCaseConstraint local_8d0;
  EqualIgnoreCaseConstraint local_890;
  OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint> local_850;
  EqualIgnoreCaseConstraint local_7b0;
  undefined8 local_770 [4];
  EqualIgnoreCaseConstraint local_750;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  local_710;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  local_610;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((this->vdWtype).super_ParameterBase.empty_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Lennard-Jones",(allocator<char> *)&local_710);
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_610,&local_50);
    std::__cxx11::string::string((string *)&local_70,(string *)&(this->vdWtype).data_);
    bVar2 = EqualIgnoreCaseConstraint::operator()((EqualIgnoreCaseConstraint *)&local_610,&local_70)
    ;
    std::__cxx11::string::~string((string *)&local_70);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_610);
    std::__cxx11::string::~string((string *)&local_50);
    if (!bVar2) {
      pcVar1 = (this->vdWtype).super_ParameterBase.keyword_._M_dataplus._M_p;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"Lennard-Jones",(allocator<char> *)&local_850);
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_610,&local_90);
      std::__cxx11::string::string((string *)&local_710,(string *)&local_610);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar1,
               local_710.
               super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
               .description_._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_710);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_610)
      ;
      std::__cxx11::string::~string((string *)&local_90);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->DistanceMixingRule).super_ParameterBase.empty_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"arithmetic",(allocator<char> *)&local_7b0);
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_850,&local_b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"geometric",(allocator<char> *)&local_750);
    isEqualIgnoreCase(&local_8d0,&local_d0);
    OpenMD::operator||((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_710,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_850,
                       &local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"cubic",(allocator<char> *)local_770);
    isEqualIgnoreCase(&local_890,&local_f0);
    OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_610,
                       (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        *)&local_710,
                       &local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    std::__cxx11::string::string((string *)&local_110,(string *)&(this->DistanceMixingRule).data_);
    bVar2 = OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
            ::operator()((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_610,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)&local_610);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_890);
    std::__cxx11::string::~string((string *)&local_f0);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_710);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_8d0);
    std::__cxx11::string::~string((string *)&local_d0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_850);
    std::__cxx11::string::~string((string *)&local_b0);
    if (!bVar2) {
      pcVar1 = (this->DistanceMixingRule).super_ParameterBase.keyword_._M_dataplus._M_p;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"arithmetic",(allocator<char> *)&local_750);
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_850,&local_130);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,"geometric",(allocator<char> *)local_770);
      isEqualIgnoreCase(&local_8d0,&local_150);
      OpenMD::operator||((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_710,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_850,
                         &local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"cubic",&local_8d4);
      isEqualIgnoreCase(&local_890,&local_170);
      OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_610,
                         (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                          *)&local_710,
                         &local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
      std::__cxx11::string::string((string *)&local_7b0,(string *)&local_610);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar1,
               local_7b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_
               ._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_7b0);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)&local_610);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_890);
      std::__cxx11::string::~string((string *)&local_170);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_710);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_8d0);
      std::__cxx11::string::~string((string *)&local_150);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_850)
      ;
      std::__cxx11::string::~string((string *)&local_130);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->DistanceType).super_ParameterBase.empty_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_190,"sigma",(allocator<char> *)&local_8d0);
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_710,&local_190);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"Rmin",(allocator<char> *)&local_890);
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_850,&local_1b0);
    OpenMD::operator||((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_610,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_710,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_850);
    std::__cxx11::string::string((string *)&local_1d0,(string *)&(this->DistanceType).data_);
    bVar2 = OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>::
            operator()((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_610,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_610);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_850);
    std::__cxx11::string::~string((string *)&local_1b0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_710);
    std::__cxx11::string::~string((string *)&local_190);
    if (!bVar2) {
      pcVar1 = (this->DistanceType).super_ParameterBase.keyword_._M_dataplus._M_p;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f0,"sigma",(allocator<char> *)&local_890);
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_710,&local_1f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,"Rmin",(allocator<char> *)&local_7b0);
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_850,&local_210);
      OpenMD::operator||((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_610,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_710,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_850);
      std::__cxx11::string::string((string *)&local_8d0,(string *)&local_610);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar1,
               local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_
               ._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_8d0);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_610);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_850)
      ;
      std::__cxx11::string::~string((string *)&local_210);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_710)
      ;
      std::__cxx11::string::~string((string *)&local_1f0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->EnergyMixingRule).super_ParameterBase.empty_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"arithmetic",(allocator<char> *)&local_7b0);
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_850,&local_230);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,"geometric",(allocator<char> *)&local_750);
    isEqualIgnoreCase(&local_8d0,&local_250);
    OpenMD::operator||((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_710,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_850,
                       &local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,"hhg",(allocator<char> *)local_770);
    isEqualIgnoreCase(&local_890,&local_270);
    OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_610,
                       (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        *)&local_710,
                       &local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    std::__cxx11::string::string((string *)&local_290,(string *)&(this->EnergyMixingRule).data_);
    bVar2 = OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
            ::operator()((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_610,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)&local_610);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_890);
    std::__cxx11::string::~string((string *)&local_270);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_710);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_8d0);
    std::__cxx11::string::~string((string *)&local_250);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_850);
    std::__cxx11::string::~string((string *)&local_230);
    if (!bVar2) {
      pcVar1 = (this->EnergyMixingRule).super_ParameterBase.keyword_._M_dataplus._M_p;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b0,"arithmetic",(allocator<char> *)&local_750);
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_850,&local_2b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2d0,"geometric",(allocator<char> *)local_770);
      isEqualIgnoreCase(&local_8d0,&local_2d0);
      OpenMD::operator||((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_710,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_850,
                         &local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"hhg",&local_8d4);
      isEqualIgnoreCase(&local_890,&local_2f0);
      OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_610,
                         (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                          *)&local_710,
                         &local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
      std::__cxx11::string::string((string *)&local_7b0,(string *)&local_610);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar1,
               local_7b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_
               ._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_7b0);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)&local_610);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_890);
      std::__cxx11::string::~string((string *)&local_2f0);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_710);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_8d0);
      std::__cxx11::string::~string((string *)&local_2d0);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_850)
      ;
      std::__cxx11::string::~string((string *)&local_2b0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->TorsionAngleConvention).super_ParameterBase.empty_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_310,"180_is_trans",(allocator<char> *)&local_8d0);
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_710,&local_310);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_330,"0_is_trans",(allocator<char> *)&local_890);
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_850,&local_330);
    OpenMD::operator||((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_610,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_710,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_850);
    std::__cxx11::string::string
              ((string *)&local_350,(string *)&(this->TorsionAngleConvention).data_);
    bVar2 = OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>::
            operator()((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_610,&local_350);
    std::__cxx11::string::~string((string *)&local_350);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_610);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_850);
    std::__cxx11::string::~string((string *)&local_330);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_710);
    std::__cxx11::string::~string((string *)&local_310);
    if (!bVar2) {
      pcVar1 = (this->TorsionAngleConvention).super_ParameterBase.keyword_._M_dataplus._M_p;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_370,"180_is_trans",(allocator<char> *)&local_890);
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_710,&local_370);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_390,"0_is_trans",(allocator<char> *)&local_7b0);
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_850,&local_390);
      OpenMD::operator||((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_610,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_710,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_850);
      std::__cxx11::string::string((string *)&local_8d0,(string *)&local_610);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar1,
               local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_
               ._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_8d0);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_610);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_850)
      ;
      std::__cxx11::string::~string((string *)&local_390);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_710)
      ;
      std::__cxx11::string::~string((string *)&local_370);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->EAMMixingMethod).super_ParameterBase.empty_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b0,"Johnson",(allocator<char> *)local_770);
    isEqualIgnoreCase(&local_8d0,&local_3b0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"Daw",&local_8d4);
    isEqualIgnoreCase(&local_890,&local_3d0);
    OpenMD::operator||(&local_850,
                       &local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>,
                       &local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"DREAM1",&local_8d2);
    isEqualIgnoreCase(&local_7b0,&local_3f0);
    OpenMD::operator||(&local_710,
                       &local_850.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                       ,&local_7b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,"DREAM2",&local_8d3);
    isEqualIgnoreCase(&local_750,&local_410);
    OpenMD::operator||(&local_610,
                       &local_710.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                       ,&local_750.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    std::__cxx11::string::string((string *)&local_430,(string *)&(this->EAMMixingMethod).data_);
    bVar2 = OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
            ::operator()((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_610,&local_430);
    std::__cxx11::string::~string((string *)&local_430);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint(&local_610);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_750);
    std::__cxx11::string::~string((string *)&local_410);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint(&local_710);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_7b0);
    std::__cxx11::string::~string((string *)&local_3f0);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint(&local_850);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_890);
    std::__cxx11::string::~string((string *)&local_3d0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_8d0);
    std::__cxx11::string::~string((string *)&local_3b0);
    if (!bVar2) {
      pcVar1 = (this->EAMMixingMethod).super_ParameterBase.keyword_._M_dataplus._M_p;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,"Johnson",&local_8d4);
      isEqualIgnoreCase(&local_8d0,&local_450);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_470,"Daw",&local_8d2);
      isEqualIgnoreCase(&local_890,&local_470);
      OpenMD::operator||(&local_850,
                         &local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>,
                         &local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"DREAM1",&local_8d3);
      isEqualIgnoreCase(&local_7b0,&local_490);
      OpenMD::operator||(&local_710,
                         &local_850.
                          super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                         ,&local_7b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>)
      ;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b0,"DREAM2",&local_8d1);
      isEqualIgnoreCase(&local_750,&local_4b0);
      OpenMD::operator||(&local_610,
                         &local_710.
                          super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                         ,&local_750.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>)
      ;
      std::__cxx11::string::string((string *)local_770,(string *)&local_610);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar1,local_770[0]);
      std::__cxx11::string::~string((string *)local_770);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint(&local_610);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_750);
      std::__cxx11::string::~string((string *)&local_4b0);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint(&local_710);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_7b0);
      std::__cxx11::string::~string((string *)&local_490);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint(&local_850);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_890);
      std::__cxx11::string::~string((string *)&local_470);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_8d0);
      std::__cxx11::string::~string((string *)&local_450);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  return;
}

Assistant:

void validateOptions() {
      CheckParameter(vdWtype, isEqualIgnoreCase(std::string("Lennard-Jones")));
      CheckParameter(DistanceMixingRule,
                     isEqualIgnoreCase(std::string("arithmetic")) ||
                         isEqualIgnoreCase(std::string("geometric")) ||
                         isEqualIgnoreCase(std::string("cubic")));
      CheckParameter(DistanceType, isEqualIgnoreCase(std::string("sigma")) ||
                                       isEqualIgnoreCase(std::string("Rmin")));
      CheckParameter(EnergyMixingRule,
                     isEqualIgnoreCase(std::string("arithmetic")) ||
                         isEqualIgnoreCase(std::string("geometric")) ||
                         isEqualIgnoreCase(std::string("hhg")));
      CheckParameter(TorsionAngleConvention,
                     isEqualIgnoreCase(std::string("180_is_trans")) ||
                         isEqualIgnoreCase(std::string("0_is_trans")));
      CheckParameter(EAMMixingMethod,
                     isEqualIgnoreCase(std::string("Johnson")) ||
                         isEqualIgnoreCase(std::string("Daw")) ||
                         isEqualIgnoreCase(std::string("DREAM1")) ||
                         isEqualIgnoreCase(std::string("DREAM2")));
    }